

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * getdeploymentinfo(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  Fallback fallback;
  RPCExamples examples;
  string description_05;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined8 in_stack_fffffffffffff738;
  undefined8 in_stack_fffffffffffff740;
  undefined8 in_stack_fffffffffffff748;
  undefined8 in_stack_fffffffffffff750;
  _Manager_type in_stack_fffffffffffff758;
  undefined8 in_stack_fffffffffffff760;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff768;
  _Vector_impl_data in_stack_fffffffffffff778;
  _Vector_impl_data in_stack_fffffffffffff790;
  undefined1 in_stack_fffffffffffff7a8 [16];
  pointer in_stack_fffffffffffff7b8;
  pointer pRVar2;
  pointer in_stack_fffffffffffff7c0;
  pointer pRVar3;
  pointer in_stack_fffffffffffff7c8;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff7d0;
  pointer in_stack_fffffffffffff7d8;
  pointer pRVar5;
  pointer in_stack_fffffffffffff7e0;
  pointer pRVar6;
  pointer in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7f0 [48];
  RPCResults local_7e0;
  allocator_type local_7c3;
  allocator<char> local_7c2;
  allocator<char> local_7c1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_7c0;
  allocator<char> local_7a2;
  allocator<char> local_7a1;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  char *local_6c0;
  size_type local_6b8;
  char local_6b0 [8];
  undefined8 uStack_6a8;
  string local_6a0 [32];
  string local_680 [32];
  RPCResult local_660;
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  RPCResult local_518 [3];
  string local_380 [32];
  string local_360 [32];
  RPCResult local_340;
  RPCArgOptions local_2b8;
  string local_270 [32];
  UniValue local_250;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1f8;
  string local_198 [32];
  RPCArg local_178;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getdeploymentinfo",&local_7a1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "Returns an object containing various state info regarding deployments of consensus changes."
             ,&local_7a2);
  std::__cxx11::string::string<std::allocator<char>>(local_198,"blockhash",&local_7c1);
  UniValue::UniValue<const_char_(&)[26],_char[26],_true>
            (&local_250,(char (*) [26])"hash of current chain tip");
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_1f8,&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"The block hash at which to query deployment state",&local_7c2);
  local_2b8.oneline_description._M_dataplus._M_p = (pointer)&local_2b8.oneline_description.field_2;
  local_2b8.skip_type_check = false;
  local_2b8.oneline_description._M_string_length = 0;
  local_2b8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_2b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_2b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_2b8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_2b8._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff740;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff738;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff748;
  name.field_2._8_8_ = in_stack_fffffffffffff750;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff760;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff758;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff768;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff778._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff778._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff778._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff790._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff790._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff790._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff7a8;
  description_05._M_string_length = (size_type)in_stack_fffffffffffff7c0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff7c8;
  description_05.field_2._8_8_ = in_stack_fffffffffffff7d0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7e0;
  opts._0_8_ = in_stack_fffffffffffff7d8;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff7e8;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff7f0._0_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff7f0._16_24_;
  opts.hidden = (bool)in_stack_fffffffffffff7f0[0x28];
  opts.also_positional = (bool)in_stack_fffffffffffff7f0[0x29];
  opts._66_6_ = in_stack_fffffffffffff7f0._42_6_;
  RPCArg::RPCArg(&local_178,name,(Type)local_198,fallback,description_05,opts);
  __l._M_len = 1;
  __l._M_array = &local_178;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_7c0,__l,&local_7c3);
  std::__cxx11::string::string<std::allocator<char>>
            (local_360,"",(allocator<char> *)&stack0xfffffffffffff81f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_380,"",(allocator<char> *)&stack0xfffffffffffff81e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,"hash",(allocator<char> *)&stack0xfffffffffffff7ff);
  std::__cxx11::string::string<std::allocator<char>>
            (local_558,"requested block hash (or tip)",(allocator<char> *)&stack0xfffffffffffff7fe);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff740;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff738;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff748;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff750;
  description._M_string_length = in_stack_fffffffffffff760;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff758;
  description.field_2 = in_stack_fffffffffffff768;
  RPCResult::RPCResult
            (local_518,STR,m_key_name,description,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffff778,
             SUB81(local_538,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_578,"height",(allocator<char> *)&stack0xfffffffffffff7d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_598,"requested block height (or tip)",(allocator<char> *)&stack0xfffffffffffff7d6
            );
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_fffffffffffff740;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff738;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff748;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff750;
  description_00._M_string_length = in_stack_fffffffffffff760;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff758;
  description_00.field_2 = in_stack_fffffffffffff768;
  RPCResult::RPCResult
            (local_518 + 1,NUM,m_key_name_00,description_00,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffff778,
             SUB81(local_578,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b8,"deployments",(allocator<char> *)&stack0xfffffffffffff7b7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5d8,"",(allocator<char> *)&stack0xfffffffffffff7b6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_680,"xxxx",(allocator<char> *)&stack0xfffffffffffff797);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6a0,"name of the deployment",(allocator<char> *)&stack0xfffffffffffff796);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff778,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             (anonymous_namespace)::RPCHelpForDeployment);
  m_key_name_01._M_string_length = in_stack_fffffffffffff740;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff738;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff748;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff750;
  description_01._M_string_length = in_stack_fffffffffffff760;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff758;
  description_01.field_2 = in_stack_fffffffffffff768;
  RPCResult::RPCResult
            (&local_660,OBJ,m_key_name_01,description_01,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffff778,
             SUB81(local_680,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_660;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff798,__l_00,
             (allocator_type *)&stack0xfffffffffffff777);
  m_key_name_02._M_string_length = in_stack_fffffffffffff740;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff738;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff748;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff750;
  description_02._M_string_length = in_stack_fffffffffffff760;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff758;
  description_02.field_2._M_local_buf = in_stack_fffffffffffff768._M_local_buf;
  RPCResult::RPCResult
            (local_518 + 2,OBJ_DYN,m_key_name_02,description_02,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffff778,
             SUB81(local_5b8,0));
  __l_01._M_len = 3;
  __l_01._M_array = local_518;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff800,__l_01,
             (allocator_type *)&stack0xfffffffffffff776);
  m_key_name_03._M_string_length = in_stack_fffffffffffff740;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff738;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff748;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff750;
  description_03._M_string_length = in_stack_fffffffffffff760;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff758;
  description_03.field_2 = in_stack_fffffffffffff768;
  RPCResult::RPCResult
            (&local_340,OBJ,m_key_name_03,description_03,
             (vector<RPCResult,_std::allocator<RPCResult>_>)in_stack_fffffffffffff778,
             SUB81(local_360,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff740;
  result._0_8_ = in_stack_fffffffffffff738;
  result.m_key_name._M_string_length = in_stack_fffffffffffff748;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff750;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff758;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff760;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff768;
  result._64_24_ = in_stack_fffffffffffff778;
  result._88_24_ = in_stack_fffffffffffff790;
  result.m_cond._8_16_ = in_stack_fffffffffffff7a8;
  result.m_cond.field_2._8_8_ = pRVar2;
  RPCResults::RPCResults(&local_7e0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"getdeploymentinfo",(allocator<char> *)&stack0xfffffffffffff775);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_740,"",(allocator<char> *)&stack0xfffffffffffff774);
  HelpExampleCli(&local_700,&local_720,&local_740);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_780,"getdeploymentinfo",(allocator<char> *)&stack0xfffffffffffff773);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a0,"",(allocator<char> *)&stack0xfffffffffffff772);
  HelpExampleRpc(&local_760,&local_780,&local_7a0);
  std::operator+(&local_6e0,&local_700,&local_760);
  local_6c0 = local_6b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p == &local_6e0.field_2) {
    uStack_6a8 = local_6e0.field_2._8_8_;
  }
  else {
    local_6c0 = local_6e0._M_dataplus._M_p;
  }
  local_6b8 = local_6e0._M_string_length;
  local_6e0._M_string_length = 0;
  local_6e0.field_2._M_local_buf[0] = '\0';
  description_04._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:1418:9)>
       ::_M_invoke;
  description_04._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:1418:9)>
                ::_M_manager;
  description_04.field_2 = in_stack_fffffffffffff768;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar2;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7a8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff7a8._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar3;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff7d0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar4;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar5;
  fun._M_invoker = (_Invoker_type)pRVar6;
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff740,&stack0xfffffffffffff748)),
             description_04,(vector<RPCArg,_std::allocator<RPCArg>_>)in_stack_fffffffffffff778,
             (RPCResults)in_stack_fffffffffffff790,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff748);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_740);
  std::__cxx11::string::~string((string *)&local_720);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_7e0.m_results);
  RPCResult::~RPCResult(&local_340);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff800);
  lVar1 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_518[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff798);
  RPCResult::~RPCResult(&local_660);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff778);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_5b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7b8);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_578);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7d8);
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_360);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_7c0);
  RPCArg::~RPCArg(&local_178);
  RPCArgOptions::~RPCArgOptions(&local_2b8);
  std::__cxx11::string::~string(local_270);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_1f8);
  UniValue::~UniValue(&local_250);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getdeploymentinfo()
{
    return RPCHelpMan{"getdeploymentinfo",
        "Returns an object containing various state info regarding deployments of consensus changes.",
        {
            {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Default{"hash of current chain tip"}, "The block hash at which to query deployment state"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::STR, "hash", "requested block hash (or tip)"},
                {RPCResult::Type::NUM, "height", "requested block height (or tip)"},
                {RPCResult::Type::OBJ_DYN, "deployments", "", {
                    {RPCResult::Type::OBJ, "xxxx", "name of the deployment", RPCHelpForDeployment}
                }},
            }
        },
        RPCExamples{ HelpExampleCli("getdeploymentinfo", "") + HelpExampleRpc("getdeploymentinfo", "") },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const ChainstateManager& chainman = EnsureAnyChainman(request.context);
            LOCK(cs_main);
            const Chainstate& active_chainstate = chainman.ActiveChainstate();

            const CBlockIndex* blockindex;
            if (request.params[0].isNull()) {
                blockindex = CHECK_NONFATAL(active_chainstate.m_chain.Tip());
            } else {
                const uint256 hash(ParseHashV(request.params[0], "blockhash"));
                blockindex = chainman.m_blockman.LookupBlockIndex(hash);
                if (!blockindex) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
                }
            }

            UniValue deploymentinfo(UniValue::VOBJ);
            deploymentinfo.pushKV("hash", blockindex->GetBlockHash().ToString());
            deploymentinfo.pushKV("height", blockindex->nHeight);
            deploymentinfo.pushKV("deployments", DeploymentInfo(blockindex, chainman));
            return deploymentinfo;
        },
    };
}